

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O0

void __thiscall
capnp::writePackedMessage
          (capnp *this,OutputStream *output,
          ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_00;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_01;
  BufferedOutputStream *inner;
  ArrayPtr<unsigned_char> buffer_00;
  undefined1 local_2090 [8];
  BufferedOutputStreamWrapper bufferedOutput;
  byte buffer [8192];
  BufferedOutputStream *bufferedOutputPtr;
  BufferedOutputStream *local_28;
  BufferedOutputStream *_bufferedOutputPtr468;
  OutputStream *output_local;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  segments_local.ptr = segments.ptr;
  _bufferedOutputPtr468 = (BufferedOutputStream *)this;
  output_local = output;
  kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream,kj::OutputStream>
            ((kj *)&bufferedOutputPtr,(OutputStream *)this);
  local_28 = kj::_::readMaybe<kj::BufferedOutputStream>
                       ((Maybe<kj::BufferedOutputStream_&> *)&bufferedOutputPtr);
  if (local_28 == (BufferedOutputStream *)0x0) {
    memset(&bufferedOutput.unwindDetector,0,0x2000);
    inner = _bufferedOutputPtr468;
    buffer_00 = kj::arrayPtr<unsigned_char>((uchar *)&bufferedOutput.unwindDetector,0x2000);
    kj::BufferedOutputStreamWrapper::BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_2090,&inner->super_OutputStream,buffer_00);
    segments_00.size_ = (size_t)segments_local.ptr;
    segments_00.ptr = (ArrayPtr<const_capnp::word> *)output_local;
    writePackedMessage((BufferedOutputStream *)local_2090,segments_00);
    kj::BufferedOutputStreamWrapper::~BufferedOutputStreamWrapper
              ((BufferedOutputStreamWrapper *)local_2090);
  }
  else {
    segments_01.size_ = (size_t)segments_local.ptr;
    segments_01.ptr = (ArrayPtr<const_capnp::word> *)output_local;
    writePackedMessage(local_28,segments_01);
  }
  return;
}

Assistant:

void writePackedMessage(kj::OutputStream& output,
                        kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_IF_SOME(bufferedOutputPtr, kj::dynamicDowncastIfAvailable<kj::BufferedOutputStream>(output)) {
    writePackedMessage(bufferedOutputPtr, segments);
  } else {
    byte buffer[8192]{};
    kj::BufferedOutputStreamWrapper bufferedOutput(output, kj::arrayPtr(buffer, sizeof(buffer)));
    writePackedMessage(bufferedOutput, segments);
  }